

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

IntegralConvertResult __thiscall
absl::str_format_internal::FormatConvertImpl
          (str_format_internal *this,VoidPtr v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  undefined2 uVar1;
  bool bVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  IntDigits *as_digits_00;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  IntDigits as_digits;
  undefined2 local_6;
  undefined1 local_4 [4];
  
  if (this == (str_format_internal *)0x0) {
    v_00._M_str = "(nil)";
    v_00._M_len = 5;
    FormatSinkImpl::Append
              ((FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_),
               v_00);
  }
  else {
    puVar3 = local_4 + 1;
    do {
      puVar4 = puVar3;
      uVar1 = *(undefined2 *)(numbers_internal::kHexTable + ((ulong)this & 0xff) * 2);
      *(undefined2 *)(puVar4 + -3) = uVar1;
      bVar2 = (str_format_internal *)0xff < this;
      puVar3 = puVar4 + -2;
      this = (str_format_internal *)((ulong)this >> 8);
    } while (bVar2);
    as_digits_00 = (IntDigits *)(puVar4 + -3);
    if ((char)uVar1 == '0') {
      as_digits_00 = (IntDigits *)(puVar4 + -2);
    }
    conv_00._0_8_ = local_4 + -(long)as_digits_00;
    conv_00.precision_ = (int)v.value;
    anon_unknown_53::ConvertIntImplInnerSlow
              (as_digits_00,conv_00,(FormatSinkImpl *)(conv._0_8_ & 0xffffffff));
  }
  return (IntegralConvertResult)true;
}

Assistant:

ArgConvertResult<FormatConversionCharSetInternal::p> FormatConvertImpl(
    VoidPtr v, const FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  if (!v.value) {
    sink->Append("(nil)");
    return {true};
  }
  IntDigits as_digits;
  as_digits.PrintAsHexLower(v.value);
  return {ConvertIntImplInnerSlow(as_digits, conv, sink)};
}